

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mthrowu.c
# Opt level: O0

int thitu(int tlev,int dam,obj *obj,obj *ostack,monst *magr,char *name)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  char *local_280;
  char *local_278;
  char *local_268;
  char local_258 [8];
  char knmbuf [256];
  char onmbuf [256];
  int local_50;
  int dieroll;
  int kprefix;
  boolean is_acid;
  char *knm;
  char *onm;
  char *name_local;
  monst *magr_local;
  obj *ostack_local;
  obj *obj_local;
  int local_10;
  int dam_local;
  int tlev_local;
  
  local_50 = 0;
  obj_local._4_4_ = dam;
  local_10 = tlev;
  if (name == (char *)0x0) {
    if (obj == (obj *)0x0) {
      panic("thitu: name & obj both null?");
    }
    if (obj->quan < 2) {
      local_268 = mshot_xname(obj);
    }
    else {
      local_268 = doname(obj);
    }
    onm = strcpy(knmbuf + 0xf8,local_268);
    pcVar3 = killer_xname(obj);
    _kprefix = strcpy(local_258,pcVar3);
    local_50 = 1;
  }
  else {
    iVar2 = strncasecmp(name,"the ",4);
    _kprefix = name;
    onm = name;
    if (((iVar2 == 0) || (iVar2 = strncasecmp(name,"an ",3), iVar2 == 0)) ||
       (iVar2 = strncasecmp(name,"a ",2), iVar2 == 0)) {
      local_50 = 1;
    }
  }
  if ((obj == (obj *)0x0) || (bVar1 = obj_is_pname(obj), bVar1 == '\0')) {
    if ((obj == (obj *)0x0) || (obj->quan < 2)) {
      local_280 = an(onm);
    }
    else {
      local_280 = onm;
    }
    local_278 = local_280;
  }
  else {
    local_278 = the(onm);
  }
  bVar4 = false;
  if (obj != (obj *)0x0) {
    bVar4 = obj->otyp == 0x219;
  }
  iVar2 = rnd(0x14);
  if (iVar2 < u.uac + local_10) {
    if ((obj == (obj *)0x0) ||
       (bVar1 = artifact_hit(magr,&youmonst,obj,ostack,'\x01',(int *)((long)&obj_local + 4),iVar2),
       bVar1 == '\0')) {
      if ((((u.uprops[0x1e].intrinsic == 0) &&
           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
          ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) && (flags.verbose != '\0')) {
        pcVar3 = exclam(obj_local._4_4_);
        pline("You are hit by %s%s",local_278,pcVar3);
      }
      else {
        pline("You are hit!");
      }
    }
    if (((obj != (obj *)0x0) && ((*(ushort *)&objects[obj->otyp].field_0x11 >> 4 & 0x1f) == 0xe)) &&
       (bVar1 = hates_silver(youmonst.data), bVar1 != '\0')) {
      iVar2 = rnd(0x14);
      obj_local._4_4_ = iVar2 + obj_local._4_4_;
      pline("The silver sears your flesh!");
      exercise(4,'\0');
    }
    if ((bVar4) && ((u.uprops[7].extrinsic != 0 || ((youmonst.mintrinsics & 0x40) != 0)))) {
      pline("It doesn\'t seem to hurt you.");
    }
    else {
      if (bVar4) {
        pline("It burns!");
      }
      if ((u.uprops[0x33].intrinsic != 0) || (u.uprops[0x33].extrinsic != 0)) {
        obj_local._4_4_ = (obj_local._4_4_ + 1) / 2;
      }
      losehp(obj_local._4_4_,_kprefix,local_50);
      exercise(0,'\0');
    }
    dam_local = 1;
  }
  else {
    if (((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
         && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
        ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) && (flags.verbose != '\0')) {
      pline("You are almost hit by %s.",local_278);
    }
    else {
      pline("It misses.");
    }
    dam_local = 0;
  }
  return dam_local;
}

Assistant:

int thitu(int tlev, int dam,
	  struct obj *obj, struct obj *ostack, struct monst *magr,
	  const char *name)	/* if null, then format `obj' */
{
	const char *onm, *knm;
	boolean is_acid;
	int kprefix = KILLED_BY_AN;
	int dieroll;
	char onmbuf[BUFSZ], knmbuf[BUFSZ];

	if (!name) {
	    if (!obj) panic("thitu: name & obj both null?");
	    name = strcpy(onmbuf,
			 (obj->quan > 1L) ? doname(obj) : mshot_xname(obj));
	    knm = strcpy(knmbuf, killer_xname(obj));
	    kprefix = KILLED_BY;  /* killer_name supplies "an" if warranted */
	} else {
	    knm = name;
	    /* [perhaps ought to check for plural here to] */
	    if (!strncmpi(name, "the ", 4) ||
		    !strncmpi(name, "an ", 3) ||
		    !strncmpi(name, "a ", 2)) kprefix = KILLED_BY;
	}
	onm = (obj && obj_is_pname(obj)) ? the(name) :
			    (obj && obj->quan > 1L) ? name : an(name);
	is_acid = (obj && obj->otyp == ACID_VENOM);

	dieroll = rnd(20);
	if (u.uac + tlev <= dieroll) {
		if (Blind || !flags.verbose) pline("It misses.");
		else pline("You are almost hit by %s.", onm);
		return 0;
	} else {
		if (!obj || !artifact_hit(magr, &youmonst, obj, ostack, TRUE,
					  &dam, dieroll)) {
			if (Blind || !flags.verbose) pline("You are hit!");
			else pline("You are hit by %s%s", onm, exclam(dam));
		}

		if (obj && objects[obj->otyp].oc_material == SILVER
				&& hates_silver(youmonst.data)) {
			dam += rnd(20);
			pline("The silver sears your flesh!");
			exercise(A_CON, FALSE);
		}
		if (is_acid && Acid_resistance)
			pline("It doesn't seem to hurt you.");
		else {
			if (is_acid) pline("It burns!");
			if (Half_physical_damage) dam = (dam+1) / 2;
			losehp(dam, knm, kprefix);
			exercise(A_STR, FALSE);
		}
		return 1;
	}
}